

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.h
# Opt level: O2

bool comparesEqual(QRectF *r1,QRect *r2)

{
  bool bVar1;
  long in_FS_OFFSET;
  QSize local_50;
  QSizeF local_48;
  QPoint local_30;
  QPointF local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.xp = r1->xp;
  local_28.yp = r1->yp;
  local_30.xp.m_i = (r2->x1).m_i;
  local_30.yp.m_i = (r2->y1).m_i;
  bVar1 = comparesEqual(&local_28,&local_30);
  if (bVar1) {
    local_48.wd = r1->w;
    local_48.ht = r1->h;
    local_50 = QRect::size(r2);
    bVar1 = comparesEqual(&local_48,&local_50);
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

constexpr bool comparesEqual(const QRectF &r1, const QRect &r2) noexcept
    { return r1.topLeft() == r2.topLeft() && r1.size() == r2.size(); }